

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O0

void __thiscall RoboClaw::crc_update(RoboClaw *this,uint8_t data)

{
  int i;
  uint8_t data_local;
  RoboClaw *this_local;
  
  this->m_crc = this->m_crc ^ (ushort)data << 8;
  for (i = 0; i < 8; i = i + 1) {
    if ((this->m_crc & 0x8000) == 0) {
      this->m_crc = this->m_crc << 1;
    }
    else {
      this->m_crc = this->m_crc << 1 ^ 0x1021;
    }
  }
  return;
}

Assistant:

void RoboClaw::crc_update( uint8_t data )
{
    int i;
    m_crc = m_crc ^ ((uint16_t)data << 8);
    for (i=0; i<8; i++)
    {
        if (m_crc & 0x8000)
            m_crc = (m_crc << 1) ^ 0x1021;
        else
            m_crc <<= 1;
    }
}